

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O1

void unodb::detail::ensure_capacity(byte **buf,size_t *cap,size_t off,size_t min_capacity)

{
  int iVar1;
  ulong uVar2;
  byte *local_38;
  
  uVar2 = min_capacity >> 1 | min_capacity;
  uVar2 = uVar2 >> 2 | uVar2;
  uVar2 = uVar2 >> 4 | uVar2;
  uVar2 = uVar2 >> 8 | uVar2;
  uVar2 = uVar2 >> 0x10 | uVar2;
  uVar2 = (uVar2 >> 0x20 | uVar2) + 1;
  if (uVar2 >> 1 == min_capacity) {
    uVar2 = min_capacity;
  }
  test::allocation_failure_injector::maybe_fail();
  iVar1 = posix_memalign(&local_38,0x10,uVar2);
  if (iVar1 != 0) {
    ensure_capacity();
  }
  if (iVar1 == 0xc || local_38 != (byte *)0x0) {
    if (local_38 != (byte *)0x0) {
      memcpy(local_38,*buf,off);
      if (0x100 < *cap) {
        free(*buf);
      }
      *buf = local_38;
      *cap = uVar2;
      return;
    }
    ensure_capacity();
  }
  __assert_fail("result != nullptr || err == 12",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./heap.hpp"
                ,0x40,"void *unodb::detail::allocate_aligned(std::size_t, std::size_t)");
}

Assistant:

inline void ensure_capacity(std::byte *&buf, size_t &cap, size_t off,
                            size_t min_capacity) {
  // Find the allocation size in bytes which satisfies that minimum capacity.
  // We first look for the next power of two.  Then we adjust for the case where
  // the [min_capacity] is already a power of two (a common edge case).
  auto nsize = detail::next_power_of_two(min_capacity);
  auto asize = (min_capacity == (nsize >> 1U)) ? min_capacity : nsize;
  auto *tmp = detail::allocate_aligned(asize);  // new allocation.
  std::memcpy(tmp, buf, off);                   // copy over the data.
  if (cap > INITIAL_BUFFER_CAPACITY) {          // free old buffer iff allocated
    detail::free_aligned(buf);
  }
  buf = static_cast<std::byte *>(tmp);
  cap = asize;
}